

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_PrintExotic_Test::TestBody
          (TextFormatTest_PrintExotic_Test *this)

{
  RepeatedField<double> *this_00;
  AlphaNum *a;
  char *message_00;
  string_view text;
  AssertionResult gtest_ar;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> local_410;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  AlphaNum local_380;
  TestAllTypes message;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&message);
  RepeatedField<long>::Add(&message.field_0._impl_.repeated_int64_,-0x8000000000000000);
  RepeatedField<unsigned_long>::Add(&message.field_0._impl_.repeated_uint64_,0xffffffffffffffff);
  this_00 = &message.field_0._impl_.repeated_double_;
  RepeatedField<double>::Add(this_00,123.456);
  RepeatedField<double>::Add(this_00,1.23e+21);
  RepeatedField<double>::Add(this_00,1.23e-18);
  RepeatedField<double>::Add(this_00,INFINITY);
  RepeatedField<double>::Add(this_00,-INFINITY);
  RepeatedField<double>::Add(this_00,NAN);
  RepeatedField<double>::Add(this_00,-NAN);
  RepeatedField<double>::Add(this_00,NAN);
  RepeatedField<double>::Add(this_00,-NAN);
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410.field_2._M_allocated_capacity = 0x90d0a0c08070100;
  local_410.field_2._8_4_ = 0x22275c0b;
  local_410._M_string_length = 0xc;
  local_410.field_2._M_local_buf[0xc] = '\0';
  internal::RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&message.field_0._impl_.repeated_string_.super_RepeatedPtrFieldBase,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  local_410._M_string_length =
       (size_type)
       (this->super_TextFormatTest).super_TextFormatTestBase.multi_line_debug_format_prefix_.
       _M_dataplus._M_p;
  local_410._M_dataplus._M_p =
       (pointer)(this->super_TextFormatTest).super_TextFormatTestBase.
                multi_line_debug_format_prefix_._M_string_length;
  local_380.piece_ =
       absl::lts_20250127::NullSafeStringView
                 (
                 "repeated_int64: -9223372036854775808\nrepeated_uint64: 18446744073709551615\nrepeated_double: 123.456\nrepeated_double: 1.23e+21\nrepeated_double: 1.23e-18\nrepeated_double: inf\nrepeated_double: -inf\nrepeated_double: nan\nrepeated_double: nan\nrepeated_double: nan\nrepeated_double: nan\nrepeated_string: \"\\000\\001\\007\\010\\014\\n\\r\\t\\013\\\\\\\'\\\"\"\n"
                 );
  a = &local_380;
  absl::lts_20250127::StrCat_abi_cxx11_(&local_3a0,(lts_20250127 *)&local_410,a,a);
  Message::DebugString_abi_cxx11_(&local_3e0,&message.super_Message);
  text._M_str = (char *)a;
  text._M_len = (size_t)local_3e0._M_dataplus._M_p;
  RemoveRedundantZeros_abi_cxx11_
            (&local_3c0,(text_format_unittest *)local_3e0._M_string_length,text);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,
             "absl::StrCat(multi_line_debug_format_prefix_, \"repeated_int64: -9223372036854775808\\n\" \"repeated_uint64: 18446744073709551615\\n\" \"repeated_double: 123.456\\n\" \"repeated_double: 1.23e+21\\n\" \"repeated_double: 1.23e-18\\n\" \"repeated_double: inf\\n\" \"repeated_double: -inf\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_double: nan\\n\" \"repeated_string: \" \"\\\"\\\\000\\\\001\\\\007\\\\010\\\\014\\\\n\\\\r\\\\t\\\\013\\\\\\\\\\\\\'\\\\\\\"\\\"\\n\")"
             ,"RemoveRedundantZeros(message.DebugString())",&local_3a0,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::__cxx11::string::~string((string *)&local_3a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_410);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message_00 = anon_var_dwarf_651463 + 5;
    }
    else {
      message_00 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,0x5fb,message_00);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_380,(Message *)&local_410);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_380);
    if ((long *)local_410._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_410._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes(&message);
  return;
}

Assistant:

TEST_F(TextFormatTest, PrintExotic) {
  unittest::TestAllTypes message;

  message.add_repeated_int64(int64_t{-9223372036854775807} - 1);
  message.add_repeated_uint64(uint64_t{18446744073709551615u});
  message.add_repeated_double(123.456);
  message.add_repeated_double(1.23e21);
  message.add_repeated_double(1.23e-18);
  message.add_repeated_double(std::numeric_limits<double>::infinity());
  message.add_repeated_double(-std::numeric_limits<double>::infinity());
  message.add_repeated_double(std::numeric_limits<double>::quiet_NaN());
  message.add_repeated_double(-std::numeric_limits<double>::quiet_NaN());
  message.add_repeated_double(std::numeric_limits<double>::signaling_NaN());
  message.add_repeated_double(-std::numeric_limits<double>::signaling_NaN());
  message.add_repeated_string(std::string("\000\001\a\b\f\n\r\t\v\\\'\"", 12));

  // Fun story:  We used to use 1.23e22 instead of 1.23e21 above, but this
  //   seemed to trigger an odd case on MinGW/GCC 3.4.5 where GCC's parsing of
  //   the value differed from strtod()'s parsing.  That is to say, the
  //   following assertion fails on MinGW:
  //     assert(1.23e22 == strtod("1.23e22", nullptr));
  //   As a result, SimpleDtoa() would print the value as
  //   "1.2300000000000001e+22" to make sure strtod() produce the exact same
  //   result.  Our goal is to test runtime parsing, not compile-time parsing,
  //   so this wasn't our problem.  It was found that using 1.23e21 did not
  //   have this problem, so we switched to that instead.

  EXPECT_EQ(
      absl::StrCat(multi_line_debug_format_prefix_,
                   "repeated_int64: -9223372036854775808\n"
                   "repeated_uint64: 18446744073709551615\n"
                   "repeated_double: 123.456\n"
                   "repeated_double: 1.23e+21\n"
                   "repeated_double: 1.23e-18\n"
                   "repeated_double: inf\n"
                   "repeated_double: -inf\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_double: nan\n"
                   "repeated_string: "
                   "\"\\000\\001\\007\\010\\014\\n\\r\\t\\013\\\\\\'\\\"\"\n"),
      RemoveRedundantZeros(message.DebugString()));
}